

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_name.cc
# Opt level: O1

void x509_name_ex_free(ASN1_VALUE **pval,ASN1_ITEM *it)

{
  ASN1_VALUE *orig_ptr;
  
  if ((pval != (ASN1_VALUE **)0x0) && (orig_ptr = *pval, orig_ptr != (ASN1_VALUE *)0x0)) {
    BUF_MEM_free(*(BUF_MEM **)(orig_ptr + 0x10));
    OPENSSL_sk_pop_free_ex
              (*(OPENSSL_STACK **)orig_ptr,sk_X509_NAME_ENTRY_call_free_func,X509_NAME_ENTRY_free);
    if (*(void **)(orig_ptr + 0x18) != (void *)0x0) {
      OPENSSL_free(*(void **)(orig_ptr + 0x18));
    }
    OPENSSL_free(orig_ptr);
    *pval = (ASN1_VALUE *)0x0;
  }
  return;
}

Assistant:

static void x509_name_ex_free(ASN1_VALUE **pval, const ASN1_ITEM *it) {
  X509_NAME *a;
  if (!pval || !*pval) {
    return;
  }
  a = (X509_NAME *)*pval;

  BUF_MEM_free(a->bytes);
  sk_X509_NAME_ENTRY_pop_free(a->entries, X509_NAME_ENTRY_free);
  if (a->canon_enc) {
    OPENSSL_free(a->canon_enc);
  }
  OPENSSL_free(a);
  *pval = NULL;
}